

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::vectorsEqual<CoreML::Specification::DoubleVector>
               (DoubleVector *a,DoubleVector *b)

{
  int iVar1;
  int i;
  int index;
  bool bVar2;
  double dVar3;
  double dVar4;
  
  index = 0;
  bVar2 = false;
  if ((a->vector_).current_size_ == (b->vector_).current_size_) {
    while (iVar1 = (a->vector_).current_size_, bVar2 = iVar1 <= index, index < iVar1) {
      dVar3 = DoubleVector::_internal_vector(a,index);
      dVar4 = DoubleVector::_internal_vector(b,index);
      index = index + 1;
      if (dVar3 != dVar4) {
        return bVar2;
      }
      if (NAN(dVar3) || NAN(dVar4)) {
        return bVar2;
      }
    }
  }
  return bVar2;
}

Assistant:

bool operator==(const NeuralNetworkMeanImage& a,
                        const NeuralNetworkMeanImage& b) {
            if (a.meanimage() != b.meanimage()) {
                return false;
            }
            return true;
        }